

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

bool ImGui_ImplGlfw_Init(GLFWwindow *window,bool install_callbacks,GlfwClientApi client_api)

{
  undefined1 uVar1;
  undefined1 extraout_AL;
  ImGuiIO *pIVar3;
  undefined8 *__s;
  GLFWerrorfun cbfun;
  GLFWcursor *pGVar4;
  undefined7 in_register_00000031;
  int iVar2;
  
  pIVar3 = ImGui::GetIO();
  __s = (undefined8 *)ImGui::MemAlloc(0xb8);
  __s[0xd] = 0;
  memset(__s,0,0xb8);
  pIVar3->BackendPlatformUserData = __s;
  pIVar3->BackendPlatformName = "imgui_impl_glfw";
  *(byte *)&pIVar3->BackendFlags = (byte)pIVar3->BackendFlags | 6;
  *__s = window;
  __s[2] = 0;
  pIVar3->SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
  pIVar3->GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
  pIVar3->ClipboardUserData = (void *)*__s;
  cbfun = glfwSetErrorCallback((GLFWerrorfun)0x0);
  pGVar4 = glfwCreateStandardCursor(0x36001);
  __s[4] = pGVar4;
  pGVar4 = glfwCreateStandardCursor(0x36002);
  __s[5] = pGVar4;
  pGVar4 = glfwCreateStandardCursor(0x36006);
  __s[7] = pGVar4;
  pGVar4 = glfwCreateStandardCursor(0x36005);
  __s[8] = pGVar4;
  pGVar4 = glfwCreateStandardCursor(0x36004);
  __s[0xb] = pGVar4;
  pGVar4 = glfwCreateStandardCursor(0x36001);
  __s[6] = pGVar4;
  pGVar4 = glfwCreateStandardCursor(0x36001);
  __s[9] = pGVar4;
  pGVar4 = glfwCreateStandardCursor(0x36001);
  __s[10] = pGVar4;
  pGVar4 = glfwCreateStandardCursor(0x36001);
  __s[0xc] = pGVar4;
  glfwSetErrorCallback(cbfun);
  iVar2 = glfwGetError((char **)0x0);
  uVar1 = (undefined1)iVar2;
  if ((int)CONCAT71(in_register_00000031,install_callbacks) != 0) {
    ImGui_ImplGlfw_InstallCallbacks(window);
    uVar1 = extraout_AL;
  }
  *(GlfwClientApi *)(__s + 1) = client_api;
  return (bool)uVar1;
}

Assistant:

static bool ImGui_ImplGlfw_Init(GLFWwindow* window, bool install_callbacks, GlfwClientApi client_api)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.BackendPlatformUserData == nullptr && "Already initialized a platform backend!");
    //printf("GLFW_VERSION: %d.%d.%d (%d)", GLFW_VERSION_MAJOR, GLFW_VERSION_MINOR, GLFW_VERSION_REVISION, GLFW_VERSION_COMBINED);

    // Setup backend capabilities flags
    ImGui_ImplGlfw_Data* bd = IM_NEW(ImGui_ImplGlfw_Data)();
    io.BackendPlatformUserData = (void*)bd;
    io.BackendPlatformName = "imgui_impl_glfw";
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;         // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;          // We can honor io.WantSetMousePos requests (optional, rarely used)

    bd->Window = window;
    bd->Time = 0.0;

    io.SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
    io.ClipboardUserData = bd->Window;

    // Set platform dependent data in viewport
#if defined(_WIN32)
    ImGui::GetMainViewport()->PlatformHandleRaw = (void*)glfwGetWin32Window(bd->Window);
#endif

    // Create mouse cursors
    // (By design, on X11 cursors are user configurable and some cursors may be missing. When a cursor doesn't exist,
    // GLFW will emit an error which will often be printed by the app, so we temporarily disable error reporting.
    // Missing cursors will return nullptr and our _UpdateMouseCursor() function will use the Arrow cursor instead.)
    GLFWerrorfun prev_error_callback = glfwSetErrorCallback(nullptr);
    bd->MouseCursors[ImGuiMouseCursor_Arrow] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_TextInput] = glfwCreateStandardCursor(GLFW_IBEAM_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNS] = glfwCreateStandardCursor(GLFW_VRESIZE_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeEW] = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_Hand] = glfwCreateStandardCursor(GLFW_HAND_CURSOR);
#if GLFW_HAS_NEW_CURSORS
    bd->MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_RESIZE_ALL_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_RESIZE_NESW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_RESIZE_NWSE_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_NOT_ALLOWED_CURSOR);
#else
    bd->MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    bd->MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
#endif
    glfwSetErrorCallback(prev_error_callback);
#if (GLFW_VERSION_COMBINED >= 3300) // Eat errors (see #5785)
    (void)glfwGetError(NULL);
#endif

    // Chain GLFW callbacks: our callbacks will call the user's previously installed callbacks, if any.
    if (install_callbacks)
        ImGui_ImplGlfw_InstallCallbacks(window);

    bd->ClientApi = client_api;
    return true;
}